

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O2

bool __thiscall QCommandLineParserPrivate::parse(QCommandLineParserPrivate *this,QStringList *args)

{
  QStringList *this_00;
  QHash<long_long,_QList<QString>_> *this_01;
  ulong uVar1;
  short sVar2;
  const_iterator cVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  Span *pSVar7;
  int iVar8;
  Flags FVar9;
  QString **ppQVar10;
  Data<QHashPrivate::Node<QString,_long_long>_> *pDVar11;
  QList<QString> *pQVar12;
  byte bVar13;
  ulong uVar14;
  bool bVar15;
  byte bVar16;
  uint uVar17;
  ulong position;
  long in_FS_OFFSET;
  bool bVar18;
  QLatin1StringView s;
  const_iterator cVar19;
  mapped_type optionOffset;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_78;
  const_iterator local_60;
  QMessageLogger local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->needsParsing = false;
  QString::clear(&this->errorText);
  this_00 = &this->positionalArgumentList;
  QList<QString>::clear(this_00);
  QList<QString>::clear(&this->optionNames);
  QList<QString>::clear(&this->unknownOptionNames);
  this_01 = &this->optionValuesHash;
  QHash<long_long,_QList<QString>_>::clear(this_01);
  if ((args->d).size == 0) {
    local_58.context.version = 2;
    local_58.context.function._4_4_ = 0;
    local_58.context.line = 0;
    local_58.context.file._0_4_ = 0;
    local_58.context.file._4_4_ = 0;
    local_58.context.function._0_4_ = 0;
    local_58.context.category = "default";
    bVar15 = false;
    QMessageLogger::warning
              (&local_58,
               "QCommandLineParser: argument list cannot be empty, it should contain at least the executable name"
              );
  }
  else {
    local_60.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    ppQVar10 = &(args->d).ptr;
    bVar15 = false;
    bVar13 = 0;
    do {
      cVar3.i = *ppQVar10;
      local_60.i = cVar3.i + 1;
      if (local_60.i == (args->d).ptr + (args->d).size) break;
      pDVar4 = cVar3.i[1].d.d;
      local_58.context.version = (int)pDVar4;
      local_58.context.line = (int)((ulong)pDVar4 >> 0x20);
      pcVar5 = cVar3.i[1].d.ptr;
      local_58.context.file._0_4_ = SUB84(pcVar5,0);
      local_58.context.file._4_4_ = (undefined4)((ulong)pcVar5 >> 0x20);
      qVar6 = cVar3.i[1].d.size;
      local_58.context.function._0_4_ = (undefined4)qVar6;
      local_58.context.function._4_4_ = (undefined4)((ulong)qVar6 >> 0x20);
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if (bVar15) {
        bVar15 = true;
        QList<QString>::emplaceBack<QString_const&>(this_00,(QString *)&local_58);
LAB_0038ef09:
        bVar18 = local_60.i == (args->d).ptr + (args->d).size;
      }
      else {
        s.m_data = "--";
        s.m_size = 2;
        bVar15 = QString::startsWith((QString *)&local_58,s,CaseSensitive);
        if (bVar15) {
          bVar15 = true;
          if (2 < CONCAT44(local_58.context.function._4_4_,local_58.context.function._0_4_)) {
            local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_78.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            QString::mid((QString *)&local_98,(QString *)&local_58,2,-1);
            QString::section((QString *)&local_78,(QString *)&local_98,(QChar)0x3d,0,0,
                             (SectionFlags)0x0);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
            bVar15 = registerFoundOption(this,(QString *)&local_78);
            bVar16 = 1;
            if (bVar15) {
              bVar15 = parseOptionValue(this,(QString *)&local_78,(QString *)&local_58,&local_60,
                                        (args->d).ptr + (args->d).size);
LAB_0038eb25:
              bVar16 = bVar15 ^ 1U | bVar13;
            }
LAB_0038eb31:
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
            bVar15 = false;
            bVar13 = bVar16;
          }
          goto LAB_0038ef09;
        }
        bVar15 = QString::startsWith((QString *)&local_58,(QChar)0x2d,CaseSensitive);
        if (!bVar15) {
          QList<QString>::emplaceBack<QString_const&>(this_00,(QString *)&local_58);
          bVar15 = this->optionsAfterPositionalArgumentsMode == ParseAsPositionalArguments;
          goto LAB_0038ef09;
        }
        uVar14 = CONCAT44(local_58.context.function._4_4_,local_58.context.function._0_4_);
        if (uVar14 != 1) {
          if (this->singleDashWordOptionMode == ParseAsLongOptions) {
            if (2 < uVar14) {
              local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_78.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
              QString::mid((QString *)&local_78,(QString *)&local_58,1,1);
              cVar19 = QHash<QString,_long_long>::constFindImpl<QString>
                                 (&this->nameHash,(QString *)&local_78);
              pDVar11 = cVar19.i.d;
              if (pDVar11 != (Data<QHashPrivate::Node<QString,_long_long>_> *)0x0 ||
                  cVar19.i.bucket != 0) {
                uVar14 = cVar19.i.bucket >> 7;
                uVar17 = (uint)cVar19.i.bucket & 0x7f;
                FVar9 = QCommandLineOption::flags
                                  ((this->commandLineOptionList).d.ptr +
                                   *(long *)(pDVar11->spans[uVar14].entries
                                             [pDVar11->spans[uVar14].offsets[uVar17]].storage.data +
                                            0x18));
                if (((uint)FVar9.super_QFlagsStorageHelper<QCommandLineOption::Flag,_4>.
                           super_QFlagsStorage<QCommandLineOption::Flag>.i & 2) != 0) {
                  registerFoundOption(this,(QString *)&local_78);
                  pQVar12 = QHash<long_long,_QList<QString>_>::operator[]
                                      (this_01,(longlong *)
                                               (pDVar11->spans[uVar14].entries
                                                [pDVar11->spans[uVar14].offsets[uVar17]].storage.
                                                data + 0x18));
                  QString::mid((QString *)&local_98,(QString *)&local_58,2,-1);
                  QList<QString>::emplaceBack<QString>(pQVar12,(QString *)&local_98);
LAB_0038eef6:
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
                  goto LAB_0038eefe;
                }
              }
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
            }
            local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_78.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            QString::mid((QString *)&local_98,(QString *)&local_58,1,-1);
            QString::section((QString *)&local_78,(QString *)&local_98,(QChar)0x3d,0,0,
                             (SectionFlags)0x0);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
            bVar15 = registerFoundOption(this,(QString *)&local_78);
            bVar16 = 1;
            if (bVar15) {
              bVar15 = parseOptionValue(this,(QString *)&local_78,(QString *)&local_58,&local_60,
                                        (args->d).ptr + (args->d).size);
              goto LAB_0038eb25;
            }
            goto LAB_0038eb31;
          }
          if (this->singleDashWordOptionMode == ParseAsCompactedShortOptions) {
            local_78.d = (Data *)0x0;
            local_78.ptr = (char16_t *)0x0;
            local_78.size = 0;
            uVar1 = 1;
            do {
              while( true ) {
                position = uVar1;
                if (uVar14 <= position) goto LAB_0038ee6b;
                QString::mid((QString *)&local_98,(QString *)&local_58,position,1);
                qVar6 = local_78.size;
                pcVar5 = local_78.ptr;
                pDVar4 = local_78.d;
                local_78.d = local_98.d;
                local_78.ptr = local_98.ptr;
                local_98.d = pDVar4;
                local_98.ptr = pcVar5;
                local_78.size = local_98.size;
                local_98.size = qVar6;
                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
                bVar15 = registerFoundOption(this,(QString *)&local_78);
                if (bVar15) break;
                uVar14 = CONCAT44(local_58.context.function._4_4_,local_58.context.function._0_4_);
                bVar13 = 1;
                uVar1 = position + 1;
              }
              cVar19 = QHash<QString,_long_long>::constFindImpl<QString>
                                 (&this->nameHash,(QString *)&local_78);
              pSVar7 = (cVar19.i.d)->spans;
              uVar14 = cVar19.i.bucket >> 7;
              optionOffset = *(mapped_type *)
                              (pSVar7[uVar14].entries
                               [pSVar7[uVar14].offsets[(uint)cVar19.i.bucket & 0x7f]].storage.data +
                              0x18);
              QCommandLineOption::valueName
                        ((QString *)&local_98,(this->commandLineOptionList).d.ptr + optionOffset);
              qVar6 = local_98.size;
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
              uVar1 = position + 1;
              if ((undefined1 *)qVar6 != (undefined1 *)0x0) {
                if ((uVar1 & 0xffffffff) <
                    CONCAT44(local_58.context.function._4_4_,local_58.context.function._0_4_)) {
                  sVar2 = *(short *)(CONCAT44(local_58.context.file._4_4_,
                                              local_58.context.file._0_4_) +
                                    (uVar1 & 0xffffffff) * 2);
                  pQVar12 = QHash<long_long,_QList<QString>_>::operator[](this_01,&optionOffset);
                  iVar8 = (int)uVar1;
                  if (sVar2 != 0x3d) {
                    iVar8 = (int)position;
                  }
                  QString::mid((QString *)&local_98,(QString *)&local_58,(ulong)(iVar8 + 1),-1);
                  QList<QString>::emplaceBack<QString>(pQVar12,(QString *)&local_98);
                  goto LAB_0038eef6;
                }
                break;
              }
              uVar14 = CONCAT44(local_58.context.function._4_4_,local_58.context.function._0_4_);
            } while ((uVar14 <= uVar1) ||
                    (*(short *)(CONCAT44(local_58.context.file._4_4_,local_58.context.file._0_4_) +
                                2 + position * 2) != 0x3d));
LAB_0038ee6b:
            bVar15 = parseOptionValue(this,(QString *)&local_78,(QString *)&local_58,&local_60,
                                      (args->d).ptr + (args->d).size);
            bVar13 = bVar13 | !bVar15;
LAB_0038eefe:
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
          }
          bVar15 = false;
          goto LAB_0038ef09;
        }
        QList<QString>::emplaceBack<QString_const&>(this_00,(QString *)&local_58);
        bVar18 = false;
        bVar15 = false;
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
      ppQVar10 = &local_60.i;
    } while (!bVar18);
    bVar15 = (bool)(bVar13 ^ 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar15;
}

Assistant:

bool QCommandLineParserPrivate::parse(const QStringList &args)
{
    needsParsing = false;
    bool error = false;

    const QLatin1Char dashChar('-');
    const QLatin1Char assignChar('=');

    bool forcePositional = false;
    errorText.clear();
    positionalArgumentList.clear();
    optionNames.clear();
    unknownOptionNames.clear();
    optionValuesHash.clear();

    if (args.isEmpty()) {
        qWarning("QCommandLineParser: argument list cannot be empty, it should contain at least the executable name");
        return false;
    }

    QStringList::const_iterator argumentIterator = args.begin();
    ++argumentIterator; // skip executable name

    for (; argumentIterator != args.end() ; ++argumentIterator) {
        QString argument = *argumentIterator;

        if (forcePositional) {
            positionalArgumentList.append(argument);
        } else if (argument.startsWith("--"_L1)) {
            if (argument.size() > 2) {
                QString optionName = argument.mid(2).section(assignChar, 0, 0);
                if (registerFoundOption(optionName)) {
                    if (!parseOptionValue(optionName, argument, &argumentIterator, args.end()))
                        error = true;
                } else {
                    error = true;
                }
            } else {
                forcePositional = true;
            }
        } else if (argument.startsWith(dashChar)) {
            if (argument.size() == 1) { // single dash ("stdin")
                positionalArgumentList.append(argument);
                continue;
            }
            switch (singleDashWordOptionMode) {
            case QCommandLineParser::ParseAsCompactedShortOptions:
            {
                QString optionName;
                bool valueFound = false;
                for (int pos = 1 ; pos < argument.size(); ++pos) {
                    optionName = argument.mid(pos, 1);
                    if (!registerFoundOption(optionName)) {
                        error = true;
                    } else {
                        const NameHash_t::const_iterator nameHashIt = nameHash.constFind(optionName);
                        Q_ASSERT(nameHashIt != nameHash.constEnd()); // checked by registerFoundOption
                        const NameHash_t::mapped_type optionOffset = *nameHashIt;
                        const bool withValue = !commandLineOptionList.at(optionOffset).valueName().isEmpty();
                        if (withValue) {
                            if (pos + 1 < argument.size()) {
                                if (argument.at(pos + 1) == assignChar)
                                    ++pos;
                                optionValuesHash[optionOffset].append(argument.mid(pos + 1));
                                valueFound = true;
                            }
                            break;
                        }
                        if (pos + 1 < argument.size() && argument.at(pos + 1) == assignChar)
                            break;
                    }
                }
                if (!valueFound && !parseOptionValue(optionName, argument, &argumentIterator, args.end()))
                    error = true;
                break;
            }
            case QCommandLineParser::ParseAsLongOptions:
            {
                if (argument.size() > 2) {
                    const QString possibleShortOptionStyleName = argument.mid(1, 1);
                    const auto shortOptionIt = nameHash.constFind(possibleShortOptionStyleName);
                    if (shortOptionIt != nameHash.constEnd()) {
                        const auto &arg = commandLineOptionList.at(*shortOptionIt);
                        if (arg.flags() & QCommandLineOption::ShortOptionStyle) {
                            registerFoundOption(possibleShortOptionStyleName);
                            optionValuesHash[*shortOptionIt].append(argument.mid(2));
                            break;
                        }
                    }
                }
                const QString optionName = argument.mid(1).section(assignChar, 0, 0);
                if (registerFoundOption(optionName)) {
                    if (!parseOptionValue(optionName, argument, &argumentIterator, args.end()))
                        error = true;
                } else {
                    error = true;
                }
                break;
            }
            }
        } else {
            positionalArgumentList.append(argument);
            if (optionsAfterPositionalArgumentsMode == QCommandLineParser::ParseAsPositionalArguments)
                forcePositional = true;
        }
        if (argumentIterator == args.end())
            break;
    }
    return !error;
}